

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::quantize
          (btAxisSweep3Internal<unsigned_short> *this,unsigned_short *out,btVector3 *point,int isMax
          )

{
  btScalar *pbVar1;
  ushort in_CX;
  ushort *in_RSI;
  btVector3 *in_RDI;
  btVector3 bVar2;
  btVector3 v;
  ushort local_54;
  ushort local_52;
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  btVector3 local_2c;
  ushort local_1c;
  ushort *local_10;
  
  local_10 = in_RSI;
  local_1c = in_CX;
  bVar2 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_RDI);
  local_2c = ::operator*((btVector3 *)CONCAT44(bVar2.m_floats[0],in_stack_ffffffffffffffc0),in_RDI);
  pbVar1 = btVector3::operator_cast_to_float_(&local_2c);
  local_4a = local_1c;
  if (0.0 < *pbVar1) {
    pbVar1 = btVector3::operator_cast_to_float_(&local_2c);
    if (*pbVar1 < (float)*(ushort *)((long)in_RDI->m_floats + 10)) {
      pbVar1 = btVector3::operator_cast_to_float_(&local_2c);
      local_4c = (ushort)(int)*pbVar1 & *(ushort *)(in_RDI->m_floats + 2) | local_1c;
    }
    else {
      local_4c = *(ushort *)((long)in_RDI->m_floats + 10) & *(ushort *)(in_RDI->m_floats + 2) |
                 local_1c;
    }
    local_4a = local_4c;
  }
  *local_10 = local_4a;
  pbVar1 = btVector3::operator_cast_to_float_(&local_2c);
  local_4e = local_1c;
  if (0.0 < pbVar1[1]) {
    pbVar1 = btVector3::operator_cast_to_float_(&local_2c);
    if (pbVar1[1] < (float)*(ushort *)((long)in_RDI->m_floats + 10)) {
      pbVar1 = btVector3::operator_cast_to_float_(&local_2c);
      local_50 = (ushort)(int)pbVar1[1] & *(ushort *)(in_RDI->m_floats + 2) | local_1c;
    }
    else {
      local_50 = *(ushort *)((long)in_RDI->m_floats + 10) & *(ushort *)(in_RDI->m_floats + 2) |
                 local_1c;
    }
    local_4e = local_50;
  }
  local_10[1] = local_4e;
  pbVar1 = btVector3::operator_cast_to_float_(&local_2c);
  local_52 = local_1c;
  if (0.0 < pbVar1[2]) {
    pbVar1 = btVector3::operator_cast_to_float_(&local_2c);
    if (pbVar1[2] < (float)*(ushort *)((long)in_RDI->m_floats + 10)) {
      pbVar1 = btVector3::operator_cast_to_float_(&local_2c);
      local_54 = (ushort)(int)pbVar1[2] & *(ushort *)(in_RDI->m_floats + 2) | local_1c;
    }
    else {
      local_54 = *(ushort *)((long)in_RDI->m_floats + 10) & *(ushort *)(in_RDI->m_floats + 2) |
                 local_1c;
    }
    local_52 = local_54;
  }
  local_10[2] = local_52;
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::quantize(BP_FP_INT_TYPE* out, const btVector3& point, int isMax) const
{
#ifdef OLD_CLAMPING_METHOD
	///problem with this clamping method is that the floating point during quantization might still go outside the range [(0|isMax) .. (m_handleSentinel&m_bpHandleMask]|isMax]
	///see http://code.google.com/p/bullet/issues/detail?id=87
	btVector3 clampedPoint(point);
	clampedPoint.setMax(m_worldAabbMin);
	clampedPoint.setMin(m_worldAabbMax);
	btVector3 v = (clampedPoint - m_worldAabbMin) * m_quantize;
	out[0] = (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v.getX() & m_bpHandleMask) | isMax);
	out[1] = (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v.getY() & m_bpHandleMask) | isMax);
	out[2] = (BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v.getZ() & m_bpHandleMask) | isMax);
#else
	btVector3 v = (point - m_worldAabbMin) * m_quantize;
	out[0]=(v[0]<=0)?(BP_FP_INT_TYPE)isMax:(v[0]>=m_handleSentinel)?(BP_FP_INT_TYPE)((m_handleSentinel&m_bpHandleMask)|isMax):(BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v[0]&m_bpHandleMask)|isMax);
	out[1]=(v[1]<=0)?(BP_FP_INT_TYPE)isMax:(v[1]>=m_handleSentinel)?(BP_FP_INT_TYPE)((m_handleSentinel&m_bpHandleMask)|isMax):(BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v[1]&m_bpHandleMask)|isMax);
	out[2]=(v[2]<=0)?(BP_FP_INT_TYPE)isMax:(v[2]>=m_handleSentinel)?(BP_FP_INT_TYPE)((m_handleSentinel&m_bpHandleMask)|isMax):(BP_FP_INT_TYPE)(((BP_FP_INT_TYPE)v[2]&m_bpHandleMask)|isMax);
#endif //OLD_CLAMPING_METHOD
}